

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O1

permInfo * setPermInfoPtr(int var)

{
  int iVar1;
  permInfo *pi;
  int *piVar2;
  uint uVar3;
  
  pi = (permInfo *)malloc(0x28);
  pi->flipCtr = 0;
  pi->varN = var;
  uVar3 = ~(-1 << ((byte)var & 0x1f));
  pi->totalFlips = uVar3;
  pi->swapCtr = 0;
  iVar1 = factorial(var);
  pi->totalSwaps = iVar1 + -1;
  piVar2 = (int *)malloc((ulong)uVar3 << 2);
  pi->flipArray = piVar2;
  piVar2 = (int *)malloc((long)iVar1 * 4 - 4);
  pi->swapArray = piVar2;
  fillInSwapArray(pi);
  fillInFlipArray(pi);
  return pi;
}

Assistant:

permInfo* setPermInfoPtr(int var)
{
	permInfo* x;
	x = (permInfo*) malloc(sizeof(permInfo));
	x->flipCtr=0;
	x->varN = var; 
	x->totalFlips=(1<<var)-1;
	x->swapCtr=0;
	x->totalSwaps=factorial(var)-1;
	x->flipArray = (int*) malloc(sizeof(int)*x->totalFlips);
	x->swapArray = (int*) malloc(sizeof(int)*x->totalSwaps);
	fillInSwapArray(x);
	fillInFlipArray(x);
	return x;
}